

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

optional<pbrt::Bounds2<int>_> * __thiscall
pstd::optional<pbrt::Bounds2<int>_>::operator=(optional<pbrt::Bounds2<int>_> *this,Bounds2<int> *v)

{
  Bounds2<int> *pBVar1;
  optional<pbrt::Bounds2<int>_> *in_RSI;
  optional<pbrt::Bounds2<int>_> *in_RDI;
  
  reset(in_RSI);
  pBVar1 = ptr((optional<pbrt::Bounds2<int>_> *)0x5d67e5);
  (pBVar1->pMin).super_Tuple2<pbrt::Point2,_int> =
       *(Tuple2<pbrt::Point2,_int> *)&in_RSI->optionalValue;
  (pBVar1->pMax).super_Tuple2<pbrt::Point2,_int> =
       *(Tuple2<pbrt::Point2,_int> *)((long)&in_RSI->optionalValue + 8);
  in_RDI->set = true;
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(const T &v) {
        reset();
        new (ptr()) T(v);
        set = true;
        return *this;
    }